

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::generateBufferVar
          (RandomSSBOLayoutCase *this,Random *rnd,BufferBlock *block,bool isLastMember)

{
  uint uVar1;
  char *name_00;
  int in_R8D;
  float fVar2;
  bool local_f5;
  bool local_ee;
  bool local_ed;
  bool local_e1;
  bool local_c9;
  BufferVar local_c8;
  deUint32 local_84;
  bool local_7f;
  bool local_7e;
  bool local_7d;
  deUint32 flags;
  bool write;
  bool read;
  bool access;
  undefined1 local_70 [8];
  VarType type;
  string name;
  bool unusedOk;
  float accessWeight;
  float writeWeight;
  float readWeight;
  bool isLastMember_local;
  BufferBlock *block_local;
  Random *rnd_local;
  RandomSSBOLayoutCase *this_local;
  
  uVar1 = this->m_features;
  Functional::(anonymous_namespace)::genName_abi_cxx11_
            ((string *)((long)&type.m_data + 8),(_anonymous_namespace_ *)0x61,'z',
             (char)this->m_bufferVarNdx,in_R8D);
  local_c9 = false;
  if (isLastMember) {
    local_c9 = (this->m_features & 0x2000) != 0;
  }
  generateType((VarType *)local_70,this,rnd,0,true,local_c9);
  local_e1 = true;
  if ((uVar1 & 0x40) != 0) {
    fVar2 = de::Random::getFloat(rnd);
    local_e1 = fVar2 < 0.85;
  }
  local_7d = local_e1;
  if (local_e1 == false) {
    local_ed = false;
  }
  else {
    fVar2 = de::Random::getFloat(rnd);
    local_ed = fVar2 < 0.7;
  }
  local_7e = local_ed;
  if ((local_7d & 1U) == 0) {
    local_f5 = false;
  }
  else {
    local_ee = true;
    if (local_ed != false) {
      fVar2 = de::Random::getFloat(rnd);
      local_ee = fVar2 < 0.7;
    }
    local_f5 = local_ee;
  }
  local_7f = local_f5;
  local_84 = (local_7e & 1) << 0xb | (uint)local_f5 << 0xc;
  name_00 = (char *)std::__cxx11::string::c_str();
  bb::BufferVar::BufferVar(&local_c8,name_00,(VarType *)local_70,local_84);
  bb::BufferBlock::addMember(block,&local_c8);
  bb::BufferVar::~BufferVar(&local_c8);
  this->m_bufferVarNdx = this->m_bufferVarNdx + 1;
  glu::VarType::~VarType((VarType *)local_70);
  std::__cxx11::string::~string((string *)((long)&type.m_data + 8));
  return;
}

Assistant:

void RandomSSBOLayoutCase::generateBufferVar (de::Random& rnd, BufferBlock& block, bool isLastMember)
{
	const float			readWeight			= 0.7f;
	const float			writeWeight			= 0.7f;
	const float			accessWeight		= 0.85f;
	const bool			unusedOk			= (m_features & FEATURE_UNUSED_VARS) != 0;
	const std::string	name				= genName('a', 'z', m_bufferVarNdx);
	const glu::VarType	type				= generateType(rnd, 0, true, isLastMember && (m_features & FEATURE_UNSIZED_ARRAYS));
	const bool			access				= !unusedOk || (rnd.getFloat() < accessWeight);
	const bool			read				= access ? (rnd.getFloat() < readWeight) : false;
	const bool			write				= access ? (!read || (rnd.getFloat() < writeWeight)) : false;
	const deUint32		flags				= (read ? ACCESS_READ : 0) | (write ? ACCESS_WRITE : 0);

	block.addMember(BufferVar(name.c_str(), type, flags));

	m_bufferVarNdx += 1;
}